

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  byte *pbVar4;
  ValueHolder *other;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ValueHolder local_c0;
  undefined2 local_b8;
  ValueHolder local_98 [5];
  ValueHolder local_70 [5];
  ValueHolder local_48;
  undefined2 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  cVar1 = *token->start_;
  uVar5 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar4 = (byte *)(token->start_ + (cVar1 == '-'));
  uVar6 = 0;
  while (pbVar4 < token->end_) {
    bVar2 = *pbVar4;
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_0010b898:
      bVar3 = decodeDouble(this,token,decoded);
      return bVar3;
    }
    pbVar4 = pbVar4 + 1;
    uVar7 = (ulong)(bVar2 - 0x30);
    if ((uVar5 / 10 <= uVar6) &&
       (((uVar5 / 10 < uVar6 || (pbVar4 != (byte *)token->end_)) || (uVar5 % 10 < uVar7))))
    goto LAB_0010b898;
    uVar6 = uVar6 * 10 + uVar7;
  }
  if ((cVar1 == '-') && (uVar6 == uVar5)) {
    other = &local_48;
    local_40 = 1;
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    local_48.int_ = -0x8000000000000000;
    goto LAB_0010b917;
  }
  if (cVar1 == '-') {
    uVar6 = -uVar6;
    other = local_70;
LAB_0010b8f5:
    *(undefined2 *)(other + 1) = 1;
  }
  else {
    if (uVar6 < 0x80000000) {
      other = local_98;
      goto LAB_0010b8f5;
    }
    other = &local_c0;
    local_b8 = 2;
  }
  other[2].int_ = 0;
  other[3].int_ = 0;
  other[4].int_ = 0;
  other->int_ = uVar6;
LAB_0010b917:
  Value::swap(decoded,(Value *)other);
  Value::~Value((Value *)other);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::maxLargestInt) + 1
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative && value == maxIntegerValue)
    decoded = Value::minLargestInt;
  else if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}